

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O0

unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
__thiscall
duckdb::CompressedMaterialization::GetCompressExpression
          (CompressedMaterialization *this,ColumnBinding *binding,LogicalType *type,
          bool *can_compress)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
  input_00;
  unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_> in_RDI;
  CompressedMaterialization *in_R8;
  BaseStatistics *stats;
  templated_unique_single_t input;
  iterator it;
  unordered_map<duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>_>
  *in_stack_ffffffffffffff68;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  *in_stack_ffffffffffffff70;
  bool local_61;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_60 [3];
  type local_48;
  ColumnBinding *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
  in_stack_ffffffffffffffc8;
  
  input_00._M_cur =
       (__node_type *)
       ::std::
       unordered_map<duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0xcfc754);
  local_61 = false;
  if (((ulong)in_R8->optimizer & 1) != 0) {
    in_stack_ffffffffffffffc8._M_cur =
         (__node_type *)
         ::std::
         unordered_map<duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = ::std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                        *)&stack0xffffffffffffffd0,
                       (_Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                        *)&stack0xffffffffffffffc8);
    local_61 = false;
    if (bVar1) {
      ::std::__detail::
      _Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_false,_true>
                    *)0xcfc7a4);
      local_61 = ::std::unique_ptr::operator_cast_to_bool
                           ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                             *)0xcfc7b0);
    }
  }
  if (local_61 == false) {
    unique_ptr<duckdb::CompressExpression,std::default_delete<duckdb::CompressExpression>,true>::
    unique_ptr<std::default_delete<duckdb::CompressExpression>,void>
              ((unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
                *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    make_uniq<duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
              ((LogicalType *)in_stack_ffffffffffffffc8._M_cur,in_stack_ffffffffffffffc0);
    ::std::__detail::
    _Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_false,_true>
                  *)0xcfc7e2);
    local_48 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
               ::operator*(in_stack_ffffffffffffff70);
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
              (local_60,(unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                         *)in_stack_ffffffffffffff68);
    GetCompressExpression
              (in_R8,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)input_00._M_cur,(BaseStatistics *)in_stack_ffffffffffffffc8._M_cur);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xcfc838);
    unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                   *)0xcfc842);
  }
  return (unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>)
         (__uniq_ptr_impl<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CompressExpression_*,_std::default_delete<duckdb::CompressExpression>_>
           .super__Head_base<0UL,_duckdb::CompressExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CompressExpression> CompressedMaterialization::GetCompressExpression(const ColumnBinding &binding,
                                                                                const LogicalType &type,
                                                                                const bool &can_compress) {
	auto it = statistics_map.find(binding);
	if (can_compress && it != statistics_map.end() && it->second) {
		auto input = make_uniq<BoundColumnRefExpression>(type, binding);
		const auto &stats = *it->second;
		return GetCompressExpression(std::move(input), stats);
	}
	return nullptr;
}